

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyListValue::IfcPropertyListValue(IfcPropertyListValue *this)

{
  IfcPropertyListValue *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa8,"IfcPropertyListValue");
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__00f98910);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>,
             &PTR_construction_vtable_24__00f98958);
  *(undefined8 *)this = 0xf98880;
  *(undefined8 *)&this->field_0xa8 = 0xf988f8;
  *(undefined8 *)&this->field_0x58 = 0xf988a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>)._vptr_ObjectHelper
       = (_func_int **)0xf988d0;
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyListValue,_2UL>).
              field_0x10);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->Unit);
  return;
}

Assistant:

IfcPropertyListValue() : Object("IfcPropertyListValue") {}